

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O2

void __thiscall pbrt::Transform::Transform(Transform *this,Quaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  SquareMatrix<4> local_58;
  
  SquareMatrix<4>::SquareMatrix(&this->m);
  SquareMatrix<4>::SquareMatrix(&this->mInv);
  fVar1 = (q->v).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (q->v).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar3 = (q->v).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar4 = q->w;
  auVar9 = SUB6416(ZEXT464(0x3f800000),0);
  auVar10 = SUB6416(ZEXT464(0xc0000000),0);
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 * fVar1 + fVar2 * fVar2)),auVar10,auVar9);
  (this->mInv).m[0][0] = auVar8._0_4_;
  fVar5 = fVar3 * fVar1 + fVar4 * fVar2;
  fVar6 = fVar3 * fVar1 - fVar4 * fVar2;
  (this->mInv).m[0][1] = fVar5 + fVar5;
  fVar7 = fVar3 * fVar2 - fVar4 * fVar1;
  fVar5 = fVar3 * fVar2 + fVar4 * fVar1;
  (this->mInv).m[0][2] = fVar7 + fVar7;
  (this->mInv).m[1][0] = fVar6 + fVar6;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar2 * fVar2)),auVar10,auVar9);
  (this->mInv).m[1][1] = auVar8._0_4_;
  fVar6 = fVar1 * fVar2 + fVar4 * fVar3;
  fVar2 = fVar1 * fVar2 - fVar4 * fVar3;
  (this->mInv).m[1][2] = fVar6 + fVar6;
  (this->mInv).m[2][0] = fVar5 + fVar5;
  (this->mInv).m[2][1] = fVar2 + fVar2;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3 + fVar1 * fVar1)),auVar10,auVar9);
  (this->mInv).m[2][2] = auVar8._0_4_;
  Transpose<4>(&local_58,&this->mInv);
  *(undefined8 *)(this->m).m[0] = local_58.m[0]._0_8_;
  *(undefined8 *)((this->m).m[0] + 2) = local_58.m[0]._8_8_;
  *(undefined8 *)(this->m).m[1] = local_58.m[1]._0_8_;
  *(undefined8 *)((this->m).m[1] + 2) = local_58.m[1]._8_8_;
  *(undefined8 *)(this->m).m[2] = local_58.m[2]._0_8_;
  *(undefined8 *)((this->m).m[2] + 2) = local_58.m[2]._8_8_;
  *(undefined8 *)(this->m).m[3] = local_58.m[3]._0_8_;
  *(undefined8 *)((this->m).m[3] + 2) = local_58.m[3]._8_8_;
  return;
}

Assistant:

inline Transform::Transform(const Quaternion &q) {
    Float xx = q.v.x * q.v.x, yy = q.v.y * q.v.y, zz = q.v.z * q.v.z;
    Float xy = q.v.x * q.v.y, xz = q.v.x * q.v.z, yz = q.v.y * q.v.z;
    Float wx = q.v.x * q.w, wy = q.v.y * q.w, wz = q.v.z * q.w;

    mInv[0][0] = 1 - 2 * (yy + zz);
    mInv[0][1] = 2 * (xy + wz);
    mInv[0][2] = 2 * (xz - wy);
    mInv[1][0] = 2 * (xy - wz);
    mInv[1][1] = 1 - 2 * (xx + zz);
    mInv[1][2] = 2 * (yz + wx);
    mInv[2][0] = 2 * (xz + wy);
    mInv[2][1] = 2 * (yz - wx);
    mInv[2][2] = 1 - 2 * (xx + yy);

    // Transpose since we are left-handed.  Ugh.
    m = Transpose(mInv);
}